

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O0

void Abc_SclPinFree(SC_Pin *p)

{
  int iVar1;
  SC_Timings *p_00;
  int local_1c;
  int i;
  SC_Timings *pTemp;
  SC_Pin *p_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(&p->vRTimings), local_1c < iVar1; local_1c = local_1c + 1)
  {
    p_00 = (SC_Timings *)Vec_PtrEntry(&p->vRTimings,local_1c);
    Abc_SclTimingsFree(p_00);
  }
  Vec_PtrErase(&p->vRTimings);
  Vec_WrdErase(&p->vFunc);
  if (p->func_text != (char *)0x0) {
    free(p->func_text);
    p->func_text = (char *)0x0;
  }
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p != (SC_Pin *)0x0) {
    free(p);
  }
  return;
}

Assistant:

static inline void Abc_SclPinFree( SC_Pin * p )
{
    SC_Timings * pTemp;
    int i;
    SC_PinForEachRTiming( p, pTemp, i )
        Abc_SclTimingsFree( pTemp );
    Vec_PtrErase( &p->vRTimings );
    Vec_WrdErase( &p->vFunc );
    ABC_FREE( p->func_text );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}